

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AuxiliaryMemorySwitches.hpp
# Opt level: O0

void __thiscall
Apple::II::
AuxiliaryMemorySwitches<Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)0,_true>_>
::set_main_paging(AuxiliaryMemorySwitches<Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)0,_true>_>
                  *this)

{
  bool bVar1;
  MainState local_16;
  AuxiliaryMemorySwitches<Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)0,_true>_>
  *pAStack_10;
  MainState previous_state;
  AuxiliaryMemorySwitches<Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)0,_true>_>
  *this_local;
  
  local_16.base = (this->main_state_).base;
  local_16.region_04_08 = (this->main_state_).region_04_08;
  local_16.region_20_40 = (this->main_state_).region_20_40;
  (this->main_state_).base.read = (bool)((this->switches_).read_auxiliary_memory & 1);
  (this->main_state_).base.write = (bool)((this->switches_).write_auxiliary_memory & 1);
  if (((this->switches_).store_80 & 1U) == 0) {
    (this->main_state_).region_20_40 = (this->main_state_).base;
    (this->main_state_).region_04_08 = (this->main_state_).region_20_40;
  }
  else {
    bVar1 = (this->switches_).video_page_2;
    (this->main_state_).region_04_08.write = (bool)(bVar1 & 1);
    (this->main_state_).region_04_08.read = (bool)(bVar1 & 1);
    if (((this->switches_).high_resolution & 1U) == 0) {
      (this->main_state_).region_20_40 = (this->main_state_).base;
    }
    else {
      bVar1 = (this->switches_).video_page_2;
      (this->main_state_).region_20_40.write = (bool)(bVar1 & 1);
      (this->main_state_).region_20_40.read = (bool)(bVar1 & 1);
    }
  }
  pAStack_10 = this;
  bVar1 = MainState::operator!=(&local_16,&this->main_state_);
  if (bVar1) {
    ConcreteMachine<(Analyser::Static::AppleII::Target::Model)0,_true>::set_paging<1>
              (this->machine_);
  }
  return;
}

Assistant:

void set_main_paging() {
			const auto previous_state = main_state_;

			// The two appropriately named switches provide the base case.
			main_state_.base.read = switches_.read_auxiliary_memory;
			main_state_.base.write = switches_.write_auxiliary_memory;

			if(switches_.store_80) {
				// If store 80 is set, use the page 2 flag for the lower carve out;
				// if both store 80 and high resolution are set, use the page 2 flag for both carve outs.
				main_state_.region_04_08.read = main_state_.region_04_08.write = switches_.video_page_2;

				if(switches_.high_resolution) {
					main_state_.region_20_40.read = main_state_.region_20_40.write = switches_.video_page_2;
				} else {
					main_state_.region_20_40 = main_state_.base;
				}
			} else {
				main_state_.region_04_08 = main_state_.region_20_40 = main_state_.base;
			}

			if(previous_state != main_state_) {
				machine_.template set_paging<PagingType::Main>();
			}
		}